

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void anon_unknown.dwarf_505b::do_free_pages(Span *span,void *ptr)

{
  undefined8 *puVar1;
  LogItem b;
  LogItem b_00;
  LogItem c;
  LogItem c_00;
  LogItem d;
  LogItem d_00;
  bool bVar2;
  undefined4 uStack_7c;
  anon_union_8_4_e5b1a622_for_u_ aStack_78;
  undefined4 uStack_6c;
  anon_union_8_4_e5b1a622_for_u_ aStack_68;
  undefined4 uStack_5c;
  anon_union_8_4_e5b1a622_for_u_ aStack_58;
  undefined4 uStack_4c;
  anon_union_8_4_e5b1a622_for_u_ aStack_48;
  undefined4 uStack_3c;
  anon_union_8_4_e5b1a622_for_u_ aStack_38;
  undefined4 uStack_2c;
  anon_union_8_4_e5b1a622_for_u_ aStack_28;
  SpinLockHolder local_20;
  SpinLockHolder h;
  
  if ((span->field_0x2b & 3) != 0) {
    d._4_4_ = uStack_5c;
    d.tag_ = 4;
    c._4_4_ = uStack_6c;
    c.tag_ = 4;
    b._4_4_ = uStack_7c;
    b.tag_ = 4;
    b.u_.str = aStack_78.str;
    c.u_.str = aStack_68.str;
    d.u_.str = aStack_58.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tcmalloc.cc"
                  ,0x5d4,(LogItem)(ZEXT816(0x12f829) << 0x40),b,c,d);
  }
  if ((void *)(span->start << 0xd) != ptr) {
    d_00._4_4_ = uStack_2c;
    d_00.tag_ = 4;
    c_00._4_4_ = uStack_3c;
    c_00.tag_ = 4;
    b_00._4_4_ = uStack_4c;
    b_00.tag_ = 4;
    b_00.u_.str = aStack_48.str;
    c_00.u_.str = aStack_38.str;
    d_00.u_.str = aStack_28.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tcmalloc.cc"
                  ,0x5d7,(LogItem)(ZEXT816(0x12f83f) << 0x40),b_00,c_00,d_00);
  }
  local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
  LOCK();
  bVar2 = tcmalloc::Static::pageheap_._8_4_ == 0;
  if (bVar2) {
    tcmalloc::Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar2) {
    SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  }
  if ((span->field_0x2b & 4) != 0) {
    puVar1 = (undefined8 *)(span->field_4).objects;
    tcmalloc::DLL_Remove(span);
    *puVar1 = tcmalloc::Static::stacktrace_allocator_._16_8_;
    tcmalloc::Static::stacktrace_allocator_._24_4_ =
         tcmalloc::Static::stacktrace_allocator_._24_4_ + -1;
    tcmalloc::Static::stacktrace_allocator_._16_8_ = puVar1;
    (span->field_4).objects = (void *)0x0;
  }
  tcmalloc::PageHeap::DeleteLocked((PageHeap *)tcmalloc::Static::pageheap_,span);
  SpinLockHolder::~SpinLockHolder(&local_20);
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void do_free_pages(Span* span, void* ptr) {
  // Check to see if the object is in use.
  CHECK_CONDITION_PRINT(span->location == Span::IN_USE,
                        "Object was not in-use");
  CHECK_CONDITION_PRINT(
      span->start << kPageShift == reinterpret_cast<uintptr_t>(ptr),
      "Pointer is not pointing to the start of a span");

  Static::pageheap()->PrepareAndDelete(span, [&] () {
    if (span->sample) {
      StackTrace* st = reinterpret_cast<StackTrace*>(span->objects);
      tcmalloc::DLL_Remove(span);
      Static::stacktrace_allocator()->Delete(st);
      span->objects = nullptr;
    }
  });
}